

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O2

var __thiscall cs_impl::array_cs_ext::back(array_cs_ext *this,array *arr)

{
  proxy *ppVar1;
  _Elt_pointer paVar2;
  long *plVar3;
  allocator local_31;
  uint *local_30;
  long local_28;
  uint local_20;
  undefined4 uStack_1c;
  undefined4 uStack_18;
  undefined4 uStack_14;
  
  paVar2 = (arr->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (paVar2 != (arr->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
                super__Deque_impl_data._M_start._M_cur) {
    if (paVar2 == (arr->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
                  super__Deque_impl_data._M_finish._M_first) {
      paVar2 = (arr->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
               super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    ppVar1 = paVar2[-1].mDat;
    if (ppVar1 != (proxy *)0x0) {
      ppVar1->refcount = ppVar1->refcount + 1;
    }
    *(proxy **)this = ppVar1;
    return (var)(proxy *)this;
  }
  plVar3 = (long *)__cxa_allocate_exception(0x20);
  std::__cxx11::string::string((string *)&local_30,"Call back() on empty array.",&local_31);
  *plVar3 = (long)(plVar3 + 2);
  if (local_30 == &local_20) {
    *(uint *)(plVar3 + 2) = local_20;
    *(undefined4 *)((long)plVar3 + 0x14) = uStack_1c;
    *(undefined4 *)(plVar3 + 3) = uStack_18;
    *(undefined4 *)((long)plVar3 + 0x1c) = uStack_14;
  }
  else {
    *plVar3 = (long)local_30;
    plVar3[2] = CONCAT44(uStack_1c,local_20);
  }
  plVar3[1] = local_28;
  local_28 = 0;
  local_20 = local_20 & 0xffffff00;
  local_30 = &local_20;
  __cxa_throw(plVar3,&cs::lang_error::typeinfo,cs::lang_error::~lang_error);
}

Assistant:

bool isalnum(char c)
		{
			return std::isalnum(c);
		}